

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

int init_compatible_string_p(node_t_conflict n,type *el_type)

{
  int iVar1;
  int iVar2;
  
  iVar2 = (int)n;
  iVar1 = 0;
  if (iVar2 == 0xf) {
    if (el_type->mode == TM_BASIC) {
      return (int)((el_type->u).basic_type == TP_UINT);
    }
  }
  else if (iVar2 == 0xe) {
    if (el_type->mode != TM_BASIC) {
      return 0;
    }
    iVar1 = 1;
    if ((el_type->u).basic_type != TP_USHORT) {
      return 0;
    }
  }
  else if ((iVar2 == 0xd) &&
          ((el_type->mode != TM_BASIC || (iVar1 = 1, 2 < (el_type->u).basic_type - TP_CHAR)))) {
    return 0;
  }
  return iVar1;
}

Assistant:

static int init_compatible_string_p (node_t n, struct type *el_type) {
  return ((n->code == N_STR && char_type_p (el_type))
          || (n->code == N_STR16 && el_type->mode == TM_BASIC
              && el_type->u.basic_type == get_uint_basic_type (2))
          || (n->code == N_STR32 && el_type->mode == TM_BASIC
              && el_type->u.basic_type == get_uint_basic_type (4)));
}